

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O2

void __thiscall deqp::egl::GLES2ThreadTest::CreateContext::exec(CreateContext *this,Thread *t)

{
  _func_int **pp_Var1;
  deUint32 dVar2;
  Thread *pTVar3;
  MessageBuilder *pMVar4;
  EGLContext pvVar5;
  TestError *this_00;
  EGLint attriblist [3];
  undefined1 local_1b0 [400];
  
  pTVar3 = (Thread *)__dynamic_cast(t,&tcu::ThreadUtil::Thread::typeinfo,&EGLThread::typeinfo,0);
  if (pTVar3 == (Thread *)0x0) {
    __cxa_bad_cast();
  }
  ((this->m_context).m_ptr)->display = this->m_display;
  attriblist[0] = 0x3098;
  attriblist[1] = 2;
  attriblist[2] = 0x3038;
  local_1b0._0_8_ = pTVar3;
  std::__cxx11::stringstream::stringstream((stringstream *)(local_1b0 + 8));
  std::operator<<((ostream *)(local_1b0 + 0x18),"Begin -- eglBindAPI(EGL_OPENGL_ES_API)");
  tcu::ThreadUtil::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndToken *)&tcu::ThreadUtil::Message::End);
  std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b0 + 8));
  pp_Var1 = pTVar3[1].super_Thread._vptr_Thread;
  (**(code **)*pp_Var1)(pp_Var1,0x30a0);
  dVar2 = (**(code **)(*pTVar3[1].super_Thread._vptr_Thread + 0xf8))();
  eglu::checkError(dVar2,"bindAPI(EGL_OPENGL_ES_API)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                   ,0x261);
  local_1b0._0_8_ = pTVar3;
  std::__cxx11::stringstream::stringstream((stringstream *)(local_1b0 + 8));
  std::operator<<((ostream *)(local_1b0 + 0x18),"End -- eglBindAPI()");
  tcu::ThreadUtil::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndToken *)&tcu::ThreadUtil::Message::End);
  std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b0 + 8));
  if ((this->m_shared).m_ptr == (GLES2Context *)0x0) {
    local_1b0._0_8_ = pTVar3;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1b0 + 8));
    std::operator<<((ostream *)(local_1b0 + 0x18),"Begin -- eglCreateContext(");
    pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<
                       ((MessageBuilder *)local_1b0,&this->m_display);
    std::operator<<((ostream *)&pMVar4->field_0x18,", ");
    pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,&this->m_config);
    std::operator<<((ostream *)&pMVar4->field_0x18,
                    ", EGL_NO_CONTEXT, { EGL_CONTEXT_CLIENT_VERSION, 2, EGL_NONE })");
    tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b0 + 8));
    pp_Var1 = pTVar3[1].super_Thread._vptr_Thread;
    pvVar5 = (EGLContext)
             (**(code **)(*pp_Var1 + 0x30))(pp_Var1,this->m_display,this->m_config,0,attriblist);
    ((this->m_context).m_ptr)->context = pvVar5;
    local_1b0._0_8_ = pTVar3;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1b0 + 8));
    std::operator<<((ostream *)(local_1b0 + 0x18),"End -- ");
    pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<
                       ((MessageBuilder *)local_1b0,&((this->m_context).m_ptr)->context);
    std::operator<<((ostream *)&pMVar4->field_0x18," = eglCreateContext()");
    tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(EndToken *)&tcu::ThreadUtil::Message::End);
  }
  else {
    local_1b0._0_8_ = pTVar3;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1b0 + 8));
    std::operator<<((ostream *)(local_1b0 + 0x18),"Begin -- eglCreateContext(");
    pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<
                       ((MessageBuilder *)local_1b0,&this->m_display);
    std::operator<<((ostream *)&pMVar4->field_0x18,", ");
    pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,&this->m_config);
    std::operator<<((ostream *)&pMVar4->field_0x18,", ");
    pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,&((this->m_shared).m_ptr)->context);
    std::operator<<((ostream *)&pMVar4->field_0x18,", { EGL_CONTEXT_CLIENT_VERSION, 2, EGL_NONE })")
    ;
    tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b0 + 8));
    pp_Var1 = pTVar3[1].super_Thread._vptr_Thread;
    pvVar5 = (EGLContext)
             (**(code **)(*pp_Var1 + 0x30))
                       (pp_Var1,this->m_display,this->m_config,((this->m_shared).m_ptr)->context,
                        attriblist);
    ((this->m_context).m_ptr)->context = pvVar5;
    local_1b0._0_8_ = pTVar3;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1b0 + 8));
    std::operator<<((ostream *)(local_1b0 + 0x18),"End -- ");
    pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<
                       ((MessageBuilder *)local_1b0,&((this->m_context).m_ptr)->context);
    std::operator<<((ostream *)&pMVar4->field_0x18," = eglCreateContext()");
    tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(EndToken *)&tcu::ThreadUtil::Message::End);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b0 + 8));
  dVar2 = (**(code **)(*pTVar3[1].super_Thread._vptr_Thread + 0xf8))();
  eglu::checkError(dVar2,"Failed to create GLES2 context",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                   ,0x275);
  if (((this->m_context).m_ptr)->context != (EGLContext)0x0) {
    return;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,(char *)0x0,"m_context->context != EGL_NO_CONTEXT",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
             ,0x276);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void CreateContext::exec (tcu::ThreadUtil::Thread& t)
{
	EGLThread& thread = dynamic_cast<EGLThread&>(t);
	m_context->display = m_display;

	const EGLint attriblist[] =
	{
		EGL_CONTEXT_CLIENT_VERSION, 2,
		EGL_NONE
	};

	thread.newMessage() << "Begin -- eglBindAPI(EGL_OPENGL_ES_API)" << tcu::ThreadUtil::Message::End;
	EGLU_CHECK_CALL(thread.egl, bindAPI(EGL_OPENGL_ES_API));
	thread.newMessage() << "End -- eglBindAPI()" << tcu::ThreadUtil::Message::End;

	if (m_shared)
	{
		DE_ASSERT(m_shared->context != EGL_NO_CONTEXT);
		DE_ASSERT(m_shared->display != EGL_NO_DISPLAY);
		DE_ASSERT(m_shared->display == m_display);

		thread.newMessage() << "Begin -- eglCreateContext(" << m_display << ", " << m_config << ", " << m_shared->context << ", { EGL_CONTEXT_CLIENT_VERSION, 2, EGL_NONE })" << tcu::ThreadUtil::Message::End;
		m_context->context = thread.egl.createContext(m_display, m_config, m_shared->context, attriblist);
		thread.newMessage() << "End -- " << m_context->context << " = eglCreateContext()" << tcu::ThreadUtil::Message::End;
	}
	else
	{
		thread.newMessage() << "Begin -- eglCreateContext(" << m_display << ", " << m_config << ", EGL_NO_CONTEXT, { EGL_CONTEXT_CLIENT_VERSION, 2, EGL_NONE })" << tcu::ThreadUtil::Message::End;
		m_context->context = thread.egl.createContext(m_display, m_config, EGL_NO_CONTEXT, attriblist);
		thread.newMessage() << "End -- " << m_context->context << " = eglCreateContext()" << tcu::ThreadUtil::Message::End;
	}

	EGLU_CHECK_MSG(thread.egl, "Failed to create GLES2 context");
	TCU_CHECK(m_context->context != EGL_NO_CONTEXT);
}